

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_array.c
# Opt level: O1

void create_curious_dynamic_array(curious_dynamic_array_t *self,int len,size_t el_size)

{
  void *pvVar1;
  
  self->last_el = -1;
  self->len = len;
  self->el_size = el_size;
  pvVar1 = malloc((long)len * el_size);
  self->array = pvVar1;
  return;
}

Assistant:

void create_curious_dynamic_array(curious_dynamic_array_t* self, int len, size_t el_size)
{
    //if the array is starting empty, then there isn't a first element;
    //setting it to -1 means we allways get out of bounds errors
    //and ensures that the next index is 0
    self->last_el = -1;

    self->len     = len;
    self->el_size = el_size;
    self->array   = malloc(len * el_size);
}